

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O2

SubpassAttachmentHandle __thiscall
myvk::RenderPassState::RegisterSubpass
          (RenderPassState *this,uint32_t subpass,char *subpass_str,VkSubpassDescriptionFlags flags)

{
  SubpassAttachmentHandle SVar1;
  uint32_t local_4c;
  char *local_48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_40;
  
  local_4c = subpass;
  local_48 = subpass_str;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*&,_unsigned_int_&,_true>(&local_40,&local_48,&local_4c);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(VkSubpassDescriptionFlags *)(*(long *)(this + 0x90) + (ulong)local_4c * 0x48) = flags;
  SVar1.m_subpass = local_4c;
  SVar1.m_state_ptr = this;
  SVar1._12_4_ = 0;
  return SVar1;
}

Assistant:

RenderPassState::SubpassAttachmentHandle RenderPassState::RegisterSubpass(uint32_t subpass, const char *subpass_str,
                                                                          VkSubpassDescriptionFlags flags) {
	assert(subpass < get_subpass_count());
	assert(m_subpass_map.find(subpass_str) == m_subpass_map.end());
	assert(m_subpass_descriptions[subpass].flags == VK_SUBPASS_DESCRIPTION_FLAG_BITS_MAX_ENUM);

	m_subpass_map.insert({subpass_str, subpass});
	m_subpass_descriptions[subpass].flags = flags;
	return {this, subpass};
}